

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessesView.cpp
# Opt level: O0

int __thiscall ProcessesView::getRowIndexByPid(ProcessesView *this,QString *pid)

{
  bool bVar1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  QModelIndex local_a8;
  undefined1 local_90 [24];
  QVariant local_78;
  undefined1 local_58 [8];
  QString row_pid;
  int local_24;
  int i;
  QString *pid_local;
  ProcessesView *this_local;
  
  local_24 = 0;
  while( true ) {
    plVar3 = (long *)QAbstractItemView::model();
    QModelIndex::QModelIndex((QModelIndex *)&row_pid.d.size);
    iVar2 = (**(code **)(*plVar3 + 0x78))(plVar3,&row_pid.d.size);
    if (iVar2 <= local_24) {
      return -1;
    }
    plVar3 = (long *)QAbstractItemView::model();
    plVar4 = (long *)QAbstractItemView::model();
    QModelIndex::QModelIndex(&local_a8);
    (**(code **)(*plVar4 + 0x60))(local_90,plVar4,local_24,3,&local_a8);
    (**(code **)(*plVar3 + 0x90))(&local_78,plVar3,local_90,0);
    QVariant::toString();
    QVariant::~QVariant(&local_78);
    bVar1 = operator==((QString *)local_58,pid);
    if (bVar1) {
      this_local._4_4_ = local_24;
    }
    QString::~QString((QString *)local_58);
    if (bVar1) break;
    local_24 = local_24 + 1;
  }
  return this_local._4_4_;
}

Assistant:

int ProcessesView::getRowIndexByPid(const QString &pid) {
    for (int i = 0; i < model()->rowCount(); i++) {
        QString row_pid = model()->data(model()->index(i, NVSMColumns::PID)).toString();

        if (row_pid == pid) {
            return i;
        }
    }

    return -1;
}